

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_String.h
# Opt level: O0

int __thiscall
axl::sl::StringBase<wchar_t,_axl::sl::StringDetailsBase<wchar_t>_>::copy
          (StringBase<wchar_t,_axl::sl::StringDetailsBase<wchar_t>_> *this,EVP_PKEY_CTX *dst,
          EVP_PKEY_CTX *src)

{
  bool bVar1;
  EVP_PKEY_CTX *pEVar2;
  C *pCVar3;
  C *end;
  bool in_stack_0000002f;
  size_t in_stack_00000030;
  StringBase<wchar_t,_axl::sl::StringDetailsBase<wchar_t>_> *in_stack_00000038;
  byte local_31;
  EVP_PKEY_CTX *local_20;
  BufHdr *this_00;
  int local_8;
  
  if ((dst == (EVP_PKEY_CTX *)
              (this->super_StringRefBase<wchar_t,_axl::sl::StringDetailsBase<wchar_t>_>).m_p) &&
     ((src == (EVP_PKEY_CTX *)0xffffffffffffffff ||
      (src == (EVP_PKEY_CTX *)
              (this->super_StringRefBase<wchar_t,_axl::sl::StringDetailsBase<wchar_t>_>).m_length)))
     ) {
    local_8 = (int)(this->super_StringRefBase<wchar_t,_axl::sl::StringDetailsBase<wchar_t>_>).
                   m_length;
  }
  else {
    local_20 = src;
    this_00 = (BufHdr *)this;
    if (src == (EVP_PKEY_CTX *)0xffffffffffffffff) {
      local_20 = (EVP_PKEY_CTX *)StringDetailsImpl<wchar_t>::calcLength((wchar_t *)dst);
    }
    if (local_20 == (EVP_PKEY_CTX *)0x0) {
      clear(this);
      local_8 = 0;
    }
    else {
      local_8 = (int)local_20;
      if (((this->super_StringRefBase<wchar_t,_axl::sl::StringDetailsBase<wchar_t>_>).m_hdr ==
           (BufHdr *)0x0) || (bVar1 = rc::BufHdr::isInsideBuffer(this_00,dst), !bVar1)) {
        pCVar3 = createBuffer(in_stack_00000038,in_stack_00000030,in_stack_0000002f);
        if (pCVar3 == (C *)0x0) {
          local_8 = -1;
        }
        else {
          StringDetailsImpl<wchar_t>::copy
                    ((EVP_PKEY_CTX *)
                     (this->super_StringRefBase<wchar_t,_axl::sl::StringDetailsBase<wchar_t>_>).m_p,
                     dst);
        }
      }
      else {
        pEVar2 = (EVP_PKEY_CTX *)
                 rc::BufHdr::getEnd((this->
                                    super_StringRefBase<wchar_t,_axl::sl::StringDetailsBase<wchar_t>_>
                                    ).m_hdr);
        (this->super_StringRefBase<wchar_t,_axl::sl::StringDetailsBase<wchar_t>_>).m_p = (C *)dst;
        (this->super_StringRefBase<wchar_t,_axl::sl::StringDetailsBase<wchar_t>_>).m_length =
             (size_t)local_20;
        local_31 = 0;
        if (dst + (long)local_20 * 4 < pEVar2) {
          local_31 = *(int *)(dst + (long)local_20 * 4) != 0 ^ 0xff;
        }
        (this->super_StringRefBase<wchar_t,_axl::sl::StringDetailsBase<wchar_t>_>).
        m_isNullTerminated = (bool)(local_31 & 1);
      }
    }
  }
  return local_8;
}

Assistant:

size_t
	copy(
		const C* p,
		size_t length = -1
	) {
		if (p == this->m_p && (length == -1 || length == this->m_length))
			return this->m_length;

		if (length == -1)
			length = Details::calcLength(p);

		if (!length) {
			clear();
			return 0;
		}

		if (this->m_hdr && this->m_hdr->isInsideBuffer(p)) {
			C* end = (C*)this->m_hdr->getEnd();
			ASSERT(p + length <= end);

			this->m_p = (C*)p;
			this->m_length = length;
			this->m_isNullTerminated = p + length < end && !p[length];
			return length;
		}

		if (!createBuffer(length, false))
			return -1;

		Details::copy(this->m_p, p, length);
		return length;
	}